

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_save_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_Vector *pFVar1;
  char *pcVar2;
  byte bVar3;
  char *tags;
  FT_Vector *vec;
  PSH_Point_conflict point;
  FT_UInt n;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  vec = (FT_Vector *)glyph->points;
  pFVar1 = glyph->outline->points;
  pcVar2 = glyph->outline->tags;
  for (point._0_4_ = 0; (uint)point < glyph->num_points; point._0_4_ = (uint)point + 1) {
    if (dimension == 0) {
      pFVar1[(uint)point].x = vec[4].x;
    }
    else {
      pFVar1[(uint)point].y = vec[4].x;
    }
    if ((vec[1].y & 0x1000000000) != 0) {
      bVar3 = 0x40;
      if (dimension == 0) {
        bVar3 = 0x20;
      }
      pcVar2[(uint)point] = pcVar2[(uint)point] | bVar3;
    }
    vec = (FT_Vector *)&vec[4].y;
  }
  return;
}

Assistant:

static void
  psh_glyph_save_points( PSH_Glyph  glyph,
                         FT_Int     dimension )
  {
    FT_UInt     n;
    PSH_Point   point = glyph->points;
    FT_Vector*  vec   = glyph->outline->points;
    char*       tags  = glyph->outline->tags;


    for ( n = 0; n < glyph->num_points; n++ )
    {
      if ( dimension == 0 )
        vec[n].x = point->cur_u;
      else
        vec[n].y = point->cur_u;

      if ( psh_point_is_strong( point ) )
        tags[n] |= (char)( ( dimension == 0 ) ? 32 : 64 );

#ifdef DEBUG_HINTER

      if ( dimension == 0 )
      {
        point->cur_x   = point->cur_u;
        point->flags_x = point->flags2 | point->flags;
      }
      else
      {
        point->cur_y   = point->cur_u;
        point->flags_y = point->flags2 | point->flags;
      }

#endif

      point++;
    }
  }